

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall hwnet::util::Timer::operator()(Timer *this)

{
  __shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            (local_28,(__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator()
            (&this->mCallback,(shared_ptr<hwnet::util::Timer> *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void Timer::operator() ()
{	
    mCallback(shared_from_this());   
}